

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader.cc
# Opt level: O3

void __thiscall lf::io::GmshReader::InitGmshFile(GmshReader *this,GMshFileV4 *msh_file)

{
  double *pdVar1;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  long *plVar2;
  long *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  PointerType pdVar5;
  unsigned_long *puVar6;
  _Bit_iterator *p_Var7;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_01;
  double dVar8;
  MeshFactory *pMVar9;
  pointer puVar10;
  pointer __s2;
  iterator iVar11;
  pointer pPVar12;
  pointer pPVar13;
  pointer pPVar14;
  pointer pEVar15;
  Entity *e;
  element_type *peVar16;
  pointer puVar17;
  pointer puVar18;
  pointer pcVar19;
  size_type sVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  pointer pvVar23;
  int iVar24;
  RefEl RVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  size_type sVar29;
  dim_t dVar30;
  DstEvaluatorType dstEvaluator;
  pointer ppVar31;
  pointer pvVar32;
  long lVar33;
  long lVar34;
  value_type this_02;
  pointer pPVar35;
  pointer pPVar36;
  pointer pPVar37;
  pointer pEVar38;
  undefined8 *puVar39;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar40;
  ostream *poVar41;
  runtime_error *prVar42;
  pointer pNVar43;
  Index index;
  ulong uVar44;
  pointer pNVar45;
  size_t __n;
  ulong uVar46;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var47;
  long extraout_RDX;
  dim_t i_1;
  pointer pEVar48;
  pointer ppVar49;
  ulong uVar50;
  pointer puVar51;
  GMshFileV4 *pGVar52;
  int iVar53;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var54;
  size_type sVar55;
  value_type vVar56;
  ulong uVar57;
  pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *element;
  pointer pEVar58;
  pointer pEVar59;
  size_t sVar60;
  pointer pPVar61;
  long lVar62;
  pointer ppVar63;
  uint i;
  ulong uVar64;
  long lVar65;
  GmshReader *pGVar66;
  bool bVar67;
  initializer_list<unsigned_long> __l;
  RefEl ref_el_1;
  Matrix<double,_3,_1,_0,_3,_1> node_coord;
  vector<unsigned_int,_std::allocator<unsigned_int>_> temp;
  MatrixXd node_coords;
  vector<unsigned_int,_std::allocator<unsigned_int>_> gi2mi;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  mi2gi;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  gi2i;
  array<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_4UL>
  gmei2gmphi;
  RefEl local_341;
  GMshFileV4 *local_340;
  string local_338;
  uint local_318;
  ulong local_310;
  undefined1 local_308 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  uint local_2e0;
  value_type local_2d0;
  string local_2c8;
  pointer local_2a8;
  pointer local_2a0;
  pointer local_298;
  GmshReader *local_290;
  ulong local_288;
  pointer local_280;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_278;
  vector<bool,_std::allocator<bool>_> local_260;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  pointer local_220;
  double *local_218;
  undefined8 uStack_210;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_208;
  ulong local_1f8;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_1f0;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_1d8;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  value_type vStack_1a0;
  variable_if_dynamic<long,__1> local_198;
  variable_if_dynamic<long,__1> vStack_190;
  Index local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 extraout_var;
  
  local_340 = msh_file;
  uVar26 = (*((this->mesh_factory_)._M_t.
              super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
              ._M_t.
              super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
              .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl)->
             _vptr_MeshFactory[1])();
  uVar27 = (**((this->mesh_factory_)._M_t.
               super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
               ._M_t.
               super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
               .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl)->
              _vptr_MeshFactory)();
  if (((uVar26 & 0xfffffffe) != 2) || ((uVar27 & 0xfffffffe) != 2)) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"GmshReader supports only 2D and 3D meshes.",0x2a);
    local_308._0_8_ = local_308 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_308,
               "dim_mesh >= 2 && dim_mesh <= 3 && dim_world >= 2 && dim_world <= 3","");
    p_Var7 = &local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish;
    local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)p_Var7;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_308,(string *)&local_260,0x165,&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,
                      (ulong)(local_338.field_2._M_allocated_capacity + 1));
    }
    if ((_Bit_iterator *)
        local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != p_Var7) {
      operator_delete(local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + 1);
    }
    if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
      operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
    }
    prVar42 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar42,"this code should not be reached");
    __cxa_throw(prVar42,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2a8 = (pointer)(local_340->nodes).min_node_tag;
  local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_260,((local_340->nodes).max_node_tag - (long)local_2a8) + 1,(bool *)local_1b8,
             (allocator_type *)local_308);
  local_310 = (ulong)uVar26;
  local_1f8 = (ulong)(uVar26 + 1);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::vector(&local_1f0,local_1f8,(allocator_type *)local_1b8);
  iVar28 = (*((this->mesh_factory_)._M_t.
              super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
              ._M_t.
              super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
              .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl)->
             _vptr_MeshFactory[1])();
  pGVar52 = local_340;
  local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
  local_290 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_238,(ulong)(iVar28 + 1),(value_type_conflict *)local_1b8,
             (allocator_type *)local_308);
  local_288 = CONCAT44(local_288._4_4_,uVar27);
  pEVar48 = (pGVar52->elements).element_blocks.
            super__Vector_base<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar59 = (pGVar52->elements).element_blocks.
            super__Vector_base<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar48 != pEVar59) {
    local_220 = pEVar59;
    do {
      uVar26 = *(uint *)&(((_Vector_base<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                            *)&pEVar48->dimension)->_M_impl).super__Vector_impl_data._M_start;
      if ((uint)local_310 < uVar26) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"mesh_factory->DimMesh() = ",0x1a);
        poVar41 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar41,", but msh-file contains entities with dimension ",0x30);
        iVar28 = DimOf(pEVar48->element_type);
        std::ostream::operator<<(poVar41,iVar28);
        pdVar5 = (PointerType)(local_308 + 0x10);
        local_308._0_8_ = pdVar5;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_308,"eb.dimension <= dim_mesh","");
        paVar4 = &local_338.field_2;
        local_338._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_338,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_308,&local_338,0x181,&local_2c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != paVar4) {
          operator_delete(local_338._M_dataplus._M_p,
                          (ulong)(local_338.field_2._M_allocated_capacity + 1));
        }
        if ((PointerType)local_308._0_8_ != pdVar5) {
          operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
        }
        local_308._0_8_ = pdVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"false","");
        local_338._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_338,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                   ,"");
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"");
        base::AssertionFailed((string *)local_308,&local_338,0x181,&local_2c8);
        goto LAB_0020c070;
      }
      uVar27 = DimOf(pEVar48->element_type);
      if (uVar26 != uVar27) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"error in GmshFile: Mismatch between entity block type (",
                   0x37);
        poVar41 = io::operator<<((ostream *)&local_1a8,pEVar48->element_type);
        std::__ostream_insert<char,std::char_traits<char>>(poVar41,") and dimension (",0x11);
        iVar28 = DimOf(pEVar48->element_type);
        poVar41 = (ostream *)std::ostream::operator<<(poVar41,iVar28);
        std::__ostream_insert<char,std::char_traits<char>>(poVar41,")",1);
        pdVar5 = (PointerType)(local_308 + 0x10);
        local_308._0_8_ = pdVar5;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_308,"eb.dimension == DimOf(eb.element_type)","");
        paVar4 = &local_338.field_2;
        local_338._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_338,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_308,&local_338,0x185,&local_2c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != paVar4) {
          operator_delete(local_338._M_dataplus._M_p,
                          (ulong)(local_338.field_2._M_allocated_capacity + 1));
        }
        if ((PointerType)local_308._0_8_ != pdVar5) {
          operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
        }
        local_308._0_8_ = pdVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"false","");
        local_338._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_338,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                   ,"");
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"");
        base::AssertionFailed((string *)local_308,&local_338,0x185,&local_2c8);
        goto LAB_0020c070;
      }
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start
      [*(int *)&(((_Vector_base<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                   *)&pEVar48->dimension)->_M_impl).super__Vector_impl_data._M_start] =
           local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start
           [*(int *)&(((_Vector_base<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                        *)&pEVar48->dimension)->_M_impl).super__Vector_impl_data._M_start] +
           (int)((ulong)((long)(pEVar48->elements).
                               super__Vector_base<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pEVar48->elements).
                              super__Vector_base<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
      if (*(int *)&(((_Vector_base<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                      *)&pEVar48->dimension)->_M_impl).super__Vector_impl_data._M_start ==
          (int)local_310) {
        RVar25 = RefElOf(pEVar48->element_type);
        local_1b8[0] = RVar25.type_;
        pEVar58 = (pointer)(pEVar48->elements).
                           super__Vector_base<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        local_2a0 = (pointer)(pEVar48->elements).
                             super__Vector_base<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
        pEVar59 = local_220;
        local_298 = pEVar48;
        if (pEVar58 != local_2a0) {
          do {
            for (uVar64 = 0; sVar29 = base::RefEl::NumNodes((RefEl *)local_1b8), uVar64 < sVar29;
                uVar64 = uVar64 + 1) {
              uVar57 = *(long *)(*(long *)&pEVar58->element_type + uVar64 * 8) - (long)local_2a8;
              if ((ulong)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                  ((long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                  (long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <=
                  uVar57) {
                std::vector<bool,_std::allocator<bool>_>::resize(&local_260,uVar57 + 1,false);
              }
              uVar44 = uVar57 + 0x3f;
              if (-1 < (long)uVar57) {
                uVar44 = uVar57;
              }
              *(ulong *)((long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                        (ulong)((uVar57 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                        ((long)uVar44 >> 6) * 8 + -8) =
                   *(ulong *)((long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + (ulong)((uVar57 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                               ((long)uVar44 >> 6) * 8 + -8) | 1L << ((byte)uVar57 & 0x3f);
            }
            pEVar58 = (pointer)&(pEVar58->elements).
                                super__Vector_base<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pEVar48 = local_298;
            pEVar59 = local_220;
          } while (pEVar58 != local_2a0);
        }
      }
      pEVar48 = pEVar48 + 1;
    } while (pEVar48 != pEVar59);
  }
  uVar64 = local_1f8;
  lVar62 = 0;
  lVar65 = 0;
  do {
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::reserve((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               *)((long)&((local_1f0.
                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar62),
              (ulong)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start[(uint)((int)local_310 + (int)lVar65)])
    ;
    lVar65 = lVar65 + -1;
    lVar62 = lVar62 + 0x18;
  } while (-lVar65 != uVar64);
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[local_310] != 0) {
    operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8._0_4_ = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&local_238,
               (ulong)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
               ((long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
               (long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,
               (value_type_conflict *)local_1b8);
    pGVar66 = local_290;
    local_1d8.
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8._0_4_ = 0xffffffff;
    local_1b8._4_4_ = 0xffffffff;
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::resize(&local_1d8,
             (ulong)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
             ((long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
             (long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,
             (value_type *)local_1b8);
    pNVar43 = (local_340->nodes).node_blocks.
              super__Vector_base<lf::io::GMshFileV4::NodeBlock,_std::allocator<lf::io::GMshFileV4::NodeBlock>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pNVar45 = (local_340->nodes).node_blocks.
              super__Vector_base<lf::io::GMshFileV4::NodeBlock,_std::allocator<lf::io::GMshFileV4::NodeBlock>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pGVar52 = local_340;
    if (pNVar45 != pNVar43) {
      uVar64 = 0;
      local_2a0 = (pointer)0x800000000000003f;
      do {
        ppVar63 = pNVar43[uVar64].nodes.
                  super__Vector_base<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar31 = pNVar43[uVar64].nodes.
                  super__Vector_base<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar31 != ppVar63) {
          pEVar48 = (pointer)&pNVar43[uVar64].nodes;
          uVar57 = 0;
          local_298 = pEVar48;
          do {
            uVar44 = ppVar63[uVar57].first - (long)local_2a8;
            if ((ulong)((long)local_1d8.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1d8.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar44) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"error: node_tag is higher than max_node_tag",0x2b);
              pdVar5 = (PointerType)(local_308 + 0x10);
              local_308._0_8_ = pdVar5;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_308,"gi2i.size() > n.first - min_node_tag","");
              paVar4 = &local_338.field_2;
              local_338._M_dataplus._M_p = (pointer)paVar4;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_338,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                         ,"");
              std::__cxx11::stringbuf::str();
              base::AssertionFailed((string *)local_308,&local_338,0x1b4,&local_2c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_338._M_dataplus._M_p != paVar4) {
                operator_delete(local_338._M_dataplus._M_p,
                                (ulong)(local_338.field_2._M_allocated_capacity + 1));
              }
              if ((PointerType)local_308._0_8_ != pdVar5) {
                operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
              }
              local_308._0_8_ = pdVar5;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"false","");
              local_338._M_dataplus._M_p = (pointer)paVar4;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_338,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                         ,"");
              local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"");
              base::AssertionFailed((string *)local_308,&local_338,0x1b4,&local_2c8);
              goto LAB_0020c070;
            }
            local_1d8.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar44].first = (uint)uVar64;
            local_1d8.
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar44].second = (uint)uVar57;
            uVar50 = uVar44 + 0x3f;
            if (-1 < (long)uVar44) {
              uVar50 = uVar44;
            }
            if ((*(ulong *)((long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           (ulong)((uVar44 & (ulong)local_2a0) < 0x8000000000000001) * 8 +
                           ((long)uVar50 >> 6) * 8 + -8) >> (uVar44 & 0x3f) & 1) != 0) {
              ppVar63 = ppVar63 + uVar57;
              if ((int)local_288 == 2) {
                dVar8 = (ppVar63->second).
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2];
                if ((dVar8 != 0.0) || (NAN(dVar8))) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,
                             "In a 2D GmshMesh, the z-coordinate of every node must be zero",0x3d);
                  pdVar5 = (PointerType)(local_308 + 0x10);
                  local_308._0_8_ = pdVar5;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_308,"n.second(2) == 0","");
                  paVar4 = &local_338.field_2;
                  local_338._M_dataplus._M_p = (pointer)paVar4;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_338,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                             ,"");
                  std::__cxx11::stringbuf::str();
                  base::AssertionFailed((string *)local_308,&local_338,0x1c0,&local_2c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                    operator_delete(local_2c8._M_dataplus._M_p,
                                    local_2c8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_338._M_dataplus._M_p != paVar4) {
                    operator_delete(local_338._M_dataplus._M_p,
                                    (ulong)(local_338.field_2._M_allocated_capacity + 1));
                  }
                  if ((PointerType)local_308._0_8_ != pdVar5) {
                    operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
                  }
                  local_308._0_8_ = pdVar5;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"false","");
                  local_338._M_dataplus._M_p = (pointer)paVar4;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_338,
                             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                             ,"");
                  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"");
                  base::AssertionFailed((string *)local_308,&local_338,0x1c0,&local_2c8);
                  goto LAB_0020c070;
                }
                local_1b8._0_8_ = &ppVar63->second;
                pMVar9 = (pGVar66->mesh_factory_)._M_t.
                         super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                         .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl;
                local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
                local_198.m_value = 0;
                local_188 = 3;
                local_208.m_storage.m_data = (double *)0x0;
                local_208.m_storage.m_rows = 0;
                vStack_1a0 = (value_type)local_1b8._0_8_;
                Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                          (&local_208,2,1);
                uVar21 = local_1b8._0_8_;
                Eigen::internal::
                resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>const,_1,1,false>,double,double>
                          ((Matrix<double,__1,_1,_0,__1,_1> *)&local_208,
                           (Block<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false> *)
                           local_1b8,(assign_op<double,_double> *)local_308);
                uVar44 = local_208.m_storage.m_rows - (local_208.m_storage.m_rows >> 0x3f) &
                         0xfffffffffffffffe;
                if (1 < local_208.m_storage.m_rows) {
                  lVar62 = 0;
                  do {
                    pdVar1 = (double *)(uVar21 + lVar62 * 8);
                    dVar8 = pdVar1[1];
                    local_208.m_storage.m_data[lVar62] = *pdVar1;
                    (local_208.m_storage.m_data + lVar62)[1] = dVar8;
                    lVar62 = lVar62 + 2;
                  } while (lVar62 < (long)uVar44);
                }
                if ((long)uVar44 < local_208.m_storage.m_rows) {
                  do {
                    local_208.m_storage.m_data[uVar44] = *(double *)(uVar21 + uVar44 * 8);
                    uVar44 = uVar44 + 1;
                  } while (local_208.m_storage.m_rows != uVar44);
                }
                uVar26 = (*pMVar9->_vptr_MeshFactory[2])(pMVar9,&local_208);
                pEVar48 = local_298;
                free(local_208.m_storage.m_data);
                pGVar66 = local_290;
              }
              else {
                pMVar9 = (pGVar66->mesh_factory_)._M_t.
                         super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                         .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl;
                local_218 = (double *)0x0;
                uStack_210 = 0;
                local_218 = (double *)Eigen::internal::aligned_malloc(0x18);
                uStack_210 = 3;
                dVar8 = (ppVar63->second).
                        super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[1];
                *local_218 = (ppVar63->second).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array[0];
                local_218[1] = dVar8;
                local_218[2] = (ppVar63->second).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[2];
                uVar26 = (*pMVar9->_vptr_MeshFactory[2])(pMVar9,&local_218);
                free(local_218);
              }
              local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[ppVar63->first - (long)local_2a8] = uVar26;
              ppVar63 = *(pointer *)pEVar48;
              ppVar31 = *(pointer *)&pEVar48->element_type;
            }
            uVar57 = uVar57 + 1;
          } while (uVar57 < (ulong)((long)ppVar31 - (long)ppVar63 >> 5));
          pNVar43 = (local_340->nodes).node_blocks.
                    super__Vector_base<lf::io::GMshFileV4::NodeBlock,_std::allocator<lf::io::GMshFileV4::NodeBlock>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pNVar45 = (local_340->nodes).node_blocks.
                    super__Vector_base<lf::io::GMshFileV4::NodeBlock,_std::allocator<lf::io::GMshFileV4::NodeBlock>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pGVar52 = local_340;
        }
        uVar64 = uVar64 + 1;
      } while (uVar64 < (ulong)(((long)pNVar45 - (long)pNVar43 >> 3) * -0x3333333333333333));
    }
    local_280 = (pointer)0x0;
    pEVar48 = (pGVar52->elements).element_blocks.
              super__Vector_base<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pGVar52->elements).element_blocks.
        super__Vector_base<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>
        ._M_impl.super__Vector_impl_data._M_finish != pEVar48) {
      local_220 = (pointer)(local_288 & 0xffffffff);
      do {
        pcVar19 = local_280;
        local_341 = RefElOf(pEVar48[(long)local_280].element_type);
        dVar30 = base::internal::DimensionImpl(local_341.type_);
        local_2a0 = pEVar48 + (long)pcVar19;
        ppVar49 = (local_2a0->elements).
                  super__Vector_base<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((local_2a0->elements).
            super__Vector_base<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppVar49) {
          local_298 = (pointer)(ulong)((int)local_310 - dVar30);
          uVar64 = 0;
          uVar57 = 0;
          do {
            puVar51 = ppVar49[uVar64].second.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar10 = ppVar49[uVar64].second.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            __n = (long)puVar10 - (long)puVar51;
            __s2 = ppVar49[uVar57].second.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
            sVar60 = (long)ppVar49[uVar57].second.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)__s2;
            if (__n == sVar60) {
              if (puVar10 == puVar51) {
                bVar67 = false;
              }
              else {
                iVar28 = bcmp(puVar51,__s2,__n);
                bVar67 = iVar28 != 0;
              }
              if (uVar64 == uVar57 || bVar67) goto LAB_0020adcb;
              pvVar32 = local_1f0.
                        super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)local_298].
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              iVar11._M_current =
                   pvVar32[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar11._M_current ==
                  pvVar32[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)(pvVar32 + -1),
                           iVar11,(unsigned_long *)&local_280);
              }
              else {
                *iVar11._M_current = (unsigned_long)local_280;
                pvVar32[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish = iVar11._M_current + 1;
              }
              goto LAB_0020b435;
            }
LAB_0020adcb:
            uVar44 = local_310;
            uVar64 = uVar57;
            if (local_341.type_ == kPoint) {
              uVar50 = (ulong)local_238.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[*__s2 - (long)local_2a8];
              if (uVar50 != 0xffffffff) {
                pvVar32 = local_1f0.
                          super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_310].
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                uVar46 = ((long)local_1f0.
                                super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_310].
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar32 >> 3) *
                         -0x5555555555555555;
                if (uVar46 < uVar50 || uVar46 - uVar50 == 0) {
                  std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::resize(local_1f0.
                           super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + local_310,
                           (ulong)(local_238.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[*__s2 - (long)local_2a8]
                                  + 1));
                  pvVar32 = local_1f0.
                            super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar44].
                            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                }
                this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)(pvVar32 + uVar50);
                iVar11._M_current = *(unsigned_long **)(this_00 + 8);
                if (iVar11._M_current == *(unsigned_long **)(this_00 + 0x10)) {
                  std::vector<unsigned_long,std::allocator<unsigned_long>>::
                  _M_realloc_insert<unsigned_long&>(this_00,iVar11,(unsigned_long *)&local_280);
                }
                else {
                  *iVar11._M_current = (unsigned_long)local_280;
                  *(unsigned_long **)(this_00 + 8) = iVar11._M_current + 1;
                }
              }
              goto LAB_0020b435;
            }
            lVar62 = base::narrow<long,unsigned_long>((long)sVar60 >> 3);
            local_278.m_storage.m_data = (double *)0x0;
            local_278.m_storage.m_rows = 0;
            local_278.m_storage.m_cols = 0;
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                      (&local_278,(Index)local_220,lVar62);
            if (0 < lVar62) {
              lVar65 = 0;
              pGVar52 = local_340;
              do {
                lVar33 = ppVar49[uVar57].second.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar65] - (long)local_2a8;
                lVar34 = (ulong)local_1d8.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar33].second * 0x20;
                lVar33 = *(long *)&(pGVar52->nodes).node_blocks.
                                   super__Vector_base<lf::io::GMshFileV4::NodeBlock,_std::allocator<lf::io::GMshFileV4::NodeBlock>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [local_1d8.
                                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar33].first].nodes.
                                   super__Vector_base<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_std::allocator<std::pair<unsigned_long,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                                   ._M_impl;
                local_338.field_2._M_allocated_capacity = *(ulong *)(lVar33 + 0x18 + lVar34);
                puVar6 = (unsigned_long *)(lVar33 + 8 + lVar34);
                local_338._M_dataplus._M_p = (pointer)*puVar6;
                local_338._M_string_length = puVar6[1];
                if ((int)local_288 == 2) {
                  local_1b8._0_8_ = &local_338;
                  local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
                  local_198.m_value = 0;
                  local_188 = 3;
                  vStack_1a0 = (value_type)local_1b8._0_8_;
                  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                             local_308,(Matrix<double,__1,__1,_0,__1,__1> *)&local_278,lVar65);
                  uVar21 = local_1b8._0_8_;
                  Eigen::internal::
                  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Block<Eigen::Matrix<double,3,1,0,3,1>,_1,1,false>,double,double>
                            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                             local_308,
                             (Block<Eigen::Matrix<double,_3,_1,_0,_3,_1>,__1,_1,_false> *)local_1b8,
                             (assign_op<double,_double> *)&local_2c8);
                  p_Var47 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_;
                  if (((local_308._0_8_ & 7) == 0) &&
                     (p_Var47 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                (ulong)((uint)((ulong)local_308._0_8_ >> 3) & 1),
                     (long)local_308._8_8_ <= (long)p_Var47)) {
                    p_Var47 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_;
                  }
                  if (0 < (long)p_Var47) {
                    p_Var54 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    do {
                      *(long *)(local_308._0_8_ + (long)p_Var54 * 8) =
                           *(long *)(uVar21 + (long)p_Var54 * 8);
                      p_Var54 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                ((long)&p_Var54->_vptr__Sp_counted_base + 1);
                    } while (p_Var47 != p_Var54);
                  }
                  lVar33 = local_308._8_8_ - (long)p_Var47;
                  p_Var54 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)&p_Var47->_vptr__Sp_counted_base +
                            (lVar33 - (lVar33 >> 0x3f) & 0xfffffffffffffffeU));
                  if (1 < lVar33) {
                    do {
                      plVar2 = (long *)(uVar21 + (long)p_Var47 * 8);
                      lVar33 = plVar2[1];
                      plVar3 = (long *)(local_308._0_8_ + (long)p_Var47 * 8);
                      *plVar3 = *plVar2;
                      plVar3[1] = lVar33;
                      p_Var47 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                ((long)&p_Var47->_vptr__Sp_counted_base + 2);
                    } while ((long)p_Var47 < (long)p_Var54);
                  }
                  pGVar52 = local_340;
                  if ((long)p_Var54 < (long)local_308._8_8_) {
                    do {
                      *(long *)(local_308._0_8_ + (long)p_Var54 * 8) =
                           *(long *)(uVar21 + (long)p_Var54 * 8);
                      p_Var54 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                ((long)&p_Var54->_vptr__Sp_counted_base + 1);
                    } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_ !=
                             p_Var54);
                  }
                }
                else {
                  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                             local_1b8,(Matrix<double,__1,__1,_0,__1,__1> *)&local_278,lVar65);
                  Eigen::internal::
                  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Matrix<double,3,1,0,3,1>,double,double>
                            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                             local_1b8,(Matrix<double,_3,_1,_0,_3,_1> *)&local_338,
                             (assign_op<double,_double> *)local_308);
                  p_Var47 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
                  if (((local_1b8._0_8_ & 7) == 0) &&
                     (p_Var47 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                (ulong)((uint)((ulong)local_1b8._0_8_ >> 3) & 1),
                     (long)local_1b8._8_8_ <= (long)p_Var47)) {
                    p_Var47 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
                  }
                  if (0 < (long)p_Var47) {
                    p_Var54 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    do {
                      *(pointer *)(local_1b8._0_8_ + (long)p_Var54 * 8) =
                           (&local_338._M_dataplus)[(long)p_Var54]._M_p;
                      p_Var54 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                ((long)&p_Var54->_vptr__Sp_counted_base + 1);
                    } while (p_Var47 != p_Var54);
                  }
                  lVar33 = local_1b8._8_8_ - (long)p_Var47;
                  p_Var54 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)&p_Var47->_vptr__Sp_counted_base +
                            (lVar33 - (lVar33 >> 0x3f) & 0xfffffffffffffffeU));
                  if (1 < lVar33) {
                    do {
                      sVar20 = (&local_338._M_string_length)[(long)p_Var47];
                      plVar2 = (long *)(local_1b8._0_8_ + (long)p_Var47 * 8);
                      *plVar2 = (long)(&local_338._M_dataplus)[(long)p_Var47]._M_p;
                      plVar2[1] = sVar20;
                      p_Var47 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                ((long)&p_Var47->_vptr__Sp_counted_base + 2);
                    } while ((long)p_Var47 < (long)p_Var54);
                  }
                  if ((long)p_Var54 < (long)local_1b8._8_8_) {
                    do {
                      *(pointer *)(local_1b8._0_8_ + (long)p_Var54 * 8) =
                           (&local_338._M_dataplus)[(long)p_Var54]._M_p;
                      p_Var54 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                ((long)&p_Var54->_vptr__Sp_counted_base + 1);
                    } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                             p_Var54);
                  }
                }
                lVar65 = lVar65 + 1;
              } while (lVar65 != lVar62);
            }
            local_2d0.first = 0;
            local_2d0.second = 0;
            switch(local_2a0->element_type) {
            case EDGE2:
              local_341.type_ = kSegment;
              std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                        ((Matrix<double,__1,__1,_0,__1,__1> *)local_1b8);
              break;
            case TRIA3:
              local_341.type_ = kTria;
              this_02 = (value_type)operator_new(0x40);
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,3,0,-1,3>>::
              PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)local_1b8,
                         (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_278);
              geometry::TriaO1::TriaO1
                        ((TriaO1 *)this_02,(Matrix<double,__1,_3,_0,__1,_3> *)local_1b8);
              goto LAB_0020b291;
            case QUAD4:
              local_341.type_ = kQuad;
              std::make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                        ((Matrix<double,__1,__1,_0,__1,__1> *)local_1b8);
              break;
            default:
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"Gmsh element type ",0x12);
              poVar41 = io::operator<<((ostream *)&local_1a8,local_2a0->element_type);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar41," not (yet) supported by GmshReader.",0x23);
              local_308._0_8_ = local_308 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"false","");
              local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_338,
                         "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
                         ,"");
              std::__cxx11::stringbuf::str();
              base::AssertionFailed((string *)local_308,&local_338,0x21c,&local_2c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_338._M_dataplus._M_p != &local_338.field_2) {
                operator_delete(local_338._M_dataplus._M_p,
                                (ulong)(local_338.field_2._M_allocated_capacity + 1));
              }
              if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
                operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
              }
              prVar42 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar42,"this code should not be reached");
              __cxa_throw(prVar42,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            case EDGE3:
              local_341.type_ = kSegment;
              this_02 = (value_type)operator_new(0x60);
              Eigen::PlainObjectBase<Eigen::Matrix<double,-1,3,0,-1,3>>::
              PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                        ((PlainObjectBase<Eigen::Matrix<double,_1,3,0,_1,3>> *)local_1b8,
                         (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_278);
              geometry::SegmentO2::SegmentO2
                        ((SegmentO2 *)this_02,(Matrix<double,__1,_3,_0,__1,_3> *)local_1b8);
LAB_0020b291:
              free((void *)local_1b8._0_8_);
              vVar56 = local_2d0;
              local_2d0 = this_02;
              goto LAB_0020b2f0;
            case TRIA6:
              local_341.type_ = kTria;
              std::make_unique<lf::geometry::TriaO2,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                        ((Matrix<double,__1,__1,_0,__1,__1> *)local_1b8);
              break;
            case QUAD9:
              local_341.type_ = kQuad;
              Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>::Block
                        ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true> *)local_1b8,
                         (Matrix<double,__1,__1,_0,__1,__1> *)&local_278,0,0,
                         local_278.m_storage.m_rows,8);
              std::
              make_unique<lf::geometry::QuadO2,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>>
                        ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true> *)local_308)
              ;
              vVar56 = local_2d0;
              uVar21 = local_308._0_8_;
              local_308._0_4_ = 0;
              local_308._4_4_ = 0;
              uVar22 = local_308._0_8_;
              local_308._0_4_ = (undefined4)uVar21;
              local_308._4_4_ = SUB84(uVar21,4);
              local_2d0.first = local_308._0_4_;
              local_2d0.second = local_308._4_4_;
              local_308._0_8_ = uVar22;
              if (vVar56 != (value_type)0x0) {
                (**(code **)(*(long *)vVar56 + 0x58))();
                vVar56 = (value_type)local_308._0_8_;
                goto LAB_0020b2f0;
              }
              goto LAB_0020b2fb;
            case QUAD8:
              local_341.type_ = kQuad;
              std::make_unique<lf::geometry::QuadO2,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
                        ((Matrix<double,__1,__1,_0,__1,__1> *)local_1b8);
            }
            uVar21 = local_1b8._0_8_;
            vVar56 = local_2d0;
            local_1b8._0_4_ = 0;
            local_1b8._4_4_ = 0;
            uVar22 = local_1b8._0_8_;
            local_1b8._0_4_ = (undefined4)uVar21;
            local_1b8._4_4_ = SUB84(uVar21,4);
            local_2d0.first = local_1b8._0_4_;
            local_2d0.second = local_1b8._4_4_;
            local_1b8._0_8_ = uVar22;
            if (vVar56 != (value_type)0x0) {
              (**(code **)(*(long *)vVar56 + 0x58))();
              vVar56 = (value_type)local_1b8._0_8_;
LAB_0020b2f0:
              if (vVar56 != (value_type)0x0) {
                (**(code **)(*(long *)vVar56 + 0x58))();
              }
            }
LAB_0020b2fb:
            sVar29 = base::RefEl::NumNodes(&local_341);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,
                       (ulong)sVar29,(allocator_type *)local_308);
            for (uVar44 = 0; sVar29 = base::RefEl::NumNodes(&local_341), uVar44 < sVar29;
                uVar44 = uVar44 + 1) {
              *(uint *)(local_1b8._0_8_ + uVar44 * 4) =
                   local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start
                   [ppVar49[uVar57].second.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar44] - (long)local_2a8];
            }
            pMVar9 = (local_290->mesh_factory_)._M_t.
                     super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>
                     .super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl;
            local_308._8_8_ = (long)(local_1b8._8_8_ - local_1b8._0_8_) >> 2;
            local_308._0_8_ = local_1b8._0_8_;
            (*pMVar9->_vptr_MeshFactory[4])
                      (pMVar9,(ulong)local_341.type_,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_308,&local_2d0
                      );
            pvVar23 = local_1f0.
                      super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_338._M_dataplus._M_p = local_280;
            __l._M_len = 1;
            __l._M_array = (iterator)&local_338;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_308,__l,
                       (allocator_type *)&local_2c8);
            std::
            vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                      ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        *)(pvVar23 + (long)local_298),
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_308);
            if ((value_type)local_308._0_8_ != (value_type)0x0) {
              operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
            }
            if ((value_type)local_1b8._0_8_ != (value_type)0x0) {
              operator_delete((void *)local_1b8._0_8_,(long)local_1a8 - local_1b8._0_8_);
            }
            if (local_2d0 != (value_type)0x0) {
              (**(code **)(*(long *)local_2d0 + 0x58))();
            }
            free(local_278.m_storage.m_data);
LAB_0020b435:
            uVar57 = uVar57 + 1;
            ppVar49 = (local_2a0->elements).
                      super__Vector_base<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar57 < (ulong)((long)(local_2a0->elements).
                                          super__Vector_base<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar49
                                   >> 5));
        }
        local_280 = local_280 + 1;
        pEVar48 = (local_340->elements).element_blocks.
                  super__Vector_base<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pGVar66 = local_290;
      } while (local_280 <
               (pointer)(((long)(local_340->elements).element_blocks.
                                super__Vector_base<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar48 >> 3) *
                        -0x3333333333333333));
    }
    (*((pGVar66->mesh_factory_)._M_t.
       super___uniq_ptr_impl<lf::mesh::MeshFactory,_std::default_delete<lf::mesh::MeshFactory>_>.
       _M_t.
       super__Tuple_impl<0UL,_lf::mesh::MeshFactory_*,_std::default_delete<lf::mesh::MeshFactory>_>.
       super__Head_base<0UL,_lf::mesh::MeshFactory_*,_false>._M_head_impl)->_vptr_MeshFactory[5])
              (local_1b8);
    uVar22 = local_1b8._8_8_;
    uVar21 = local_1b8._0_8_;
    pGVar52 = local_340;
    local_1b8._0_4_ = 0;
    local_1b8._4_4_ = 0;
    local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var47 = (pGVar66->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (pGVar66->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar21;
    (pGVar66->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar22;
    if ((p_Var47 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var47),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
    }
    local_168 = 0;
    uStack_160 = 0;
    local_178 = 0;
    uStack_170 = 0;
    local_188 = 0;
    uStack_180 = 0;
    local_198.m_value = 0;
    vStack_190.m_value = 0;
    local_1a8 = (pointer)0x0;
    vStack_1a0 = (value_type)0x0;
    local_1b8._0_4_ = 0;
    local_1b8._4_4_ = 0;
    local_1b8._8_8_ = 0;
    local_298 = (pointer)(local_310 * 3);
    this_01 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)(local_1b8 + local_310 * 0x18);
    if ((pGVar52->partitioned_entities).num_partitions == 0) {
      pPVar36 = (pGVar52->entities).
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Head_base<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar13 = (pGVar52->entities).
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Head_base<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar36 == pPVar13) {
        sVar55 = 1;
      }
      else {
        iVar28 = 0;
        do {
          iVar53 = pPVar36->tag;
          if (pPVar36->tag < iVar28) {
            iVar53 = iVar28;
          }
          iVar28 = iVar53;
          pPVar36 = pPVar36 + 1;
        } while (pPVar36 != pPVar13);
        sVar55 = (size_type)(iVar28 + 1);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize(this_01,sVar55);
      pPVar13 = (local_340->entities).
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Head_base<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pPVar36 = (local_340->entities).
                     super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                     .
                     super__Head_base<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>
                     ._M_impl.super__Vector_impl_data._M_start; pPVar36 != pPVar13;
          pPVar36 = pPVar36 + 1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((this_01->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + pPVar36->tag,&pPVar36->physical_tags
                  );
      }
      iVar28 = (int)local_310;
      pEVar38 = (local_340->entities).
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Head_base<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar15 = (local_340->entities).
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Head_base<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pEVar38 == pEVar15) {
        sVar55 = 1;
      }
      else {
        iVar53 = 0;
        do {
          iVar24 = pEVar38->tag;
          if (pEVar38->tag < iVar53) {
            iVar24 = iVar53;
          }
          iVar53 = iVar24;
          pEVar38 = pEVar38 + 1;
        } while (pEVar38 != pEVar15);
        sVar55 = (size_type)(iVar53 + 1);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)(local_1b8 + (ulong)(iVar28 - 1) * 0x18),sVar55);
      pEVar15 = (local_340->entities).
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Head_base<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pEVar38 = (local_340->entities).
                     super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                     .
                     super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                     .
                     super__Head_base<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>
                     ._M_impl.super__Vector_impl_data._M_start; pEVar38 != pEVar15;
          pEVar38 = pEVar38 + 1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(local_1b8 + (ulong)(iVar28 - 1) * 0x18))->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + pEVar38->tag,&pEVar38->physical_tags
                  );
      }
      iVar28 = (int)local_310;
      pEVar38 = (local_340->entities).
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Head_base<2UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar15 = (local_340->entities).
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Head_base<2UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pEVar38 == pEVar15) {
        sVar55 = 1;
      }
      else {
        iVar53 = 0;
        do {
          iVar24 = pEVar38->tag;
          if (pEVar38->tag < iVar53) {
            iVar24 = iVar53;
          }
          iVar53 = iVar24;
          pEVar38 = pEVar38 + 1;
        } while (pEVar38 != pEVar15);
        sVar55 = (size_type)(iVar53 + 1);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)(local_1b8 + (ulong)(iVar28 - 2) * 0x18),sVar55);
      pEVar15 = (local_340->entities).
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                .
                super__Head_base<2UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pEVar38 = (local_340->entities).
                     super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                     .
                     super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                     .
                     super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                     .
                     super__Head_base<2UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>
                     ._M_impl.super__Vector_impl_data._M_start; pGVar66 = local_290,
          pEVar38 != pEVar15; pEVar38 = pEVar38 + 1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(local_1b8 + (ulong)(iVar28 - 2) * 0x18))->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + pEVar38->tag,&pEVar38->physical_tags
                  );
      }
      if ((uint)local_310 == 3) {
        pEVar38 = *(pointer *)
                   &(local_340->entities).
                    super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                    .
                    super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                    .
                    super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                    .
                    super__Tuple_impl<3UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                    .
                    super__Head_base<3UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_false>
                    ._M_head_impl.
                    super__Vector_base<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>
        ;
        pEVar15 = (local_340->entities).
                  super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                  .
                  super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                  .
                  super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                  .
                  super__Tuple_impl<3UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                  .
                  super__Head_base<3UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_false>
                  ._M_head_impl.
                  super__Vector_base<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pEVar38 == pEVar15) {
          sVar55 = 1;
        }
        else {
          iVar28 = 0;
          do {
            iVar53 = pEVar38->tag;
            if (pEVar38->tag < iVar28) {
              iVar53 = iVar28;
            }
            iVar28 = iVar53;
            pEVar38 = pEVar38 + 1;
          } while (pEVar38 != pEVar15);
          sVar55 = (size_type)(iVar28 + 1);
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)local_1b8,sVar55);
        pEVar15 = (local_340->entities).
                  super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                  .
                  super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                  .
                  super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                  .
                  super__Tuple_impl<3UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                  .
                  super__Head_base<3UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_false>
                  ._M_head_impl.
                  super__Vector_base<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pEVar38 = *(pointer *)
                        &(local_340->entities).
                         super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                         .
                         super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                         .
                         super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                         .
                         super__Tuple_impl<3UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>
                         .
                         super__Head_base<3UL,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_false>
                         ._M_head_impl.
                         super__Vector_base<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>
            ; pEVar38 != pEVar15; pEVar38 = pEVar38 + 1) {
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)pEVar38->tag * 0x18 + local_1b8._0_8_),&pEVar38->physical_tags);
        }
      }
    }
    else {
      pPVar35 = (pGVar52->partitioned_entities).partitioned_entities.
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Head_base<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar12 = (pGVar52->partitioned_entities).partitioned_entities.
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Head_base<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar35 == pPVar12) {
        sVar55 = 1;
      }
      else {
        iVar28 = 0;
        do {
          iVar53 = pPVar35->tag;
          if (pPVar35->tag < iVar28) {
            iVar53 = iVar28;
          }
          iVar28 = iVar53;
          pPVar35 = pPVar35 + 1;
        } while (pPVar35 != pPVar12);
        sVar55 = (size_type)(iVar28 + 1);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize(this_01,sVar55);
      pPVar12 = (local_340->partitioned_entities).partitioned_entities.
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Head_base<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pPVar35 = (local_340->partitioned_entities).partitioned_entities.
                     super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                     .
                     super__Head_base<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>
                     ._M_impl.super__Vector_impl_data._M_start; pPVar35 != pPVar12;
          pPVar35 = pPVar35 + 1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((this_01->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + pPVar35->tag,&pPVar35->physical_tags
                  );
      }
      iVar28 = (int)local_310;
      pPVar37 = (local_340->partitioned_entities).partitioned_entities.
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Head_base<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar14 = (local_340->partitioned_entities).partitioned_entities.
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Head_base<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar37 == pPVar14) {
        sVar55 = 1;
      }
      else {
        iVar53 = 0;
        do {
          iVar24 = pPVar37->tag;
          if (pPVar37->tag < iVar53) {
            iVar24 = iVar53;
          }
          iVar53 = iVar24;
          pPVar37 = pPVar37 + 1;
        } while (pPVar37 != pPVar14);
        sVar55 = (size_type)(iVar53 + 1);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)(local_1b8 + (ulong)(iVar28 - 1) * 0x18),sVar55);
      pPVar14 = (local_340->partitioned_entities).partitioned_entities.
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Head_base<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pPVar37 = (local_340->partitioned_entities).partitioned_entities.
                     super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                     .
                     super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                     .
                     super__Head_base<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>
                     ._M_impl.super__Vector_impl_data._M_start; pPVar37 != pPVar14;
          pPVar37 = pPVar37 + 1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(local_1b8 + (ulong)(iVar28 - 1) * 0x18))->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + pPVar37->tag,&pPVar37->physical_tags
                  );
      }
      iVar28 = (int)local_310;
      pPVar37 = (local_340->partitioned_entities).partitioned_entities.
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Head_base<2UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar14 = (local_340->partitioned_entities).partitioned_entities.
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Head_base<2UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar37 == pPVar14) {
        sVar55 = 1;
      }
      else {
        iVar53 = 0;
        do {
          iVar24 = pPVar37->tag;
          if (pPVar37->tag < iVar53) {
            iVar24 = iVar53;
          }
          iVar53 = iVar24;
          pPVar37 = pPVar37 + 1;
        } while (pPVar37 != pPVar14);
        sVar55 = (size_type)(iVar53 + 1);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)(local_1b8 + (ulong)(iVar28 - 2) * 0x18),sVar55);
      pPVar14 = (local_340->partitioned_entities).partitioned_entities.
                super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                .
                super__Head_base<2UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_false>
                ._M_head_impl.
                super__Vector_base<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pPVar37 = (local_340->partitioned_entities).partitioned_entities.
                     super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                     .
                     super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                     .
                     super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                     .
                     super__Head_base<2UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_false>
                     ._M_head_impl.
                     super__Vector_base<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>
                     ._M_impl.super__Vector_impl_data._M_start; pGVar66 = local_290,
          pPVar37 != pPVar14; pPVar37 = pPVar37 + 1) {
        std::vector<int,_std::allocator<int>_>::operator=
                  ((((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(local_1b8 + (ulong)(iVar28 - 2) * 0x18))->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + pPVar37->tag,&pPVar37->physical_tags
                  );
      }
      if ((uint)local_310 == 3) {
        pPVar37 = *(pointer *)
                   &(local_340->partitioned_entities).partitioned_entities.
                    super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                    .
                    super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                    .
                    super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                    .
                    super__Tuple_impl<3UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                    .
                    super__Head_base<3UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_false>
                    ._M_head_impl.
                    super__Vector_base<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>
        ;
        pPVar14 = (local_340->partitioned_entities).partitioned_entities.
                  super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                  .
                  super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                  .
                  super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                  .
                  super__Tuple_impl<3UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                  .
                  super__Head_base<3UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_false>
                  ._M_head_impl.
                  super__Vector_base<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pPVar37 == pPVar14) {
          sVar55 = 1;
        }
        else {
          iVar28 = 0;
          do {
            iVar53 = pPVar37->tag;
            if (pPVar37->tag < iVar28) {
              iVar53 = iVar28;
            }
            iVar28 = iVar53;
            pPVar37 = pPVar37 + 1;
          } while (pPVar37 != pPVar14);
          sVar55 = (size_type)(iVar28 + 1);
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)local_1b8,sVar55);
        pPVar14 = (local_340->partitioned_entities).partitioned_entities.
                  super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                  .
                  super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                  .
                  super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                  .
                  super__Tuple_impl<3UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                  .
                  super__Head_base<3UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_false>
                  ._M_head_impl.
                  super__Vector_base<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pPVar37 = *(pointer *)
                        &(local_340->partitioned_entities).partitioned_entities.
                         super__Tuple_impl<0UL,_std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                         .
                         super__Tuple_impl<1UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                         .
                         super__Tuple_impl<2UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                         .
                         super__Tuple_impl<3UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>
                         .
                         super__Head_base<3UL,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_false>
                         ._M_head_impl.
                         super__Vector_base<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>
            ; pPVar37 != pPVar14; pPVar37 = pPVar37 + 1) {
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)
                     ((long)pPVar37->tag * 0x18 + local_1b8._0_8_),&pPVar37->physical_tags);
        }
      }
    }
    pGVar52 = local_340;
    local_338._M_dataplus._M_p =
         (pointer)(pGVar66->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
    local_338._M_string_length =
         (size_type)
         (pGVar66->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._M_string_length)->
             _M_use_count + 1;
      }
    }
    lf::mesh::utils::
    make_AllCodimMeshDataSet<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((utils *)local_308,(shared_ptr<const_lf::mesh::Mesh> *)&local_338);
    uVar22 = local_308._8_8_;
    uVar21 = local_308._0_8_;
    local_308._0_8_ = (PointerType)0x0;
    local_308._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    p_Var47 = (pGVar66->physical_nrs_).
              super___shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (pGVar66->physical_nrs_).
    super___shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)uVar21;
    (pGVar66->physical_nrs_).
    super___shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar22;
    if ((p_Var47 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var47),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_308._8_8_ !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._M_string_length);
    }
    uVar64 = 0;
    do {
      local_288 = uVar64;
      iVar28 = (*((pGVar66->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_vptr_Mesh[2])();
      puVar39 = (undefined8 *)CONCAT44(extraout_var,iVar28);
      if (extraout_RDX != 0) {
        local_2a0 = (pointer)(puVar39 + extraout_RDX);
        local_2a8 = (pointer)(local_288 * 3);
        lVar62 = local_288 * 0x18;
        do {
          e = (Entity *)*puVar39;
          peVar16 = (pGVar66->mesh_).super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          uVar26 = (*peVar16->_vptr_Mesh[5])(peVar16,e);
          uVar64 = (ulong)uVar26;
          if (((local_288 != local_310) ||
              (uVar57 = ((long)(&((local_1f0.
                                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish)[(long)local_298] -
                         (long)(&((local_1f0.
                                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)[(long)local_298] >> 3)
                        * -0x5555555555555555, uVar64 <= uVar57 && uVar57 - uVar64 != 0)) &&
             (uVar57 = ((long)(&((local_1f0.
                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish)[(long)local_2a8] -
                        (long)(&((local_1f0.
                                  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)[(long)local_2a8] >> 3) *
                       -0x5555555555555555, uVar64 <= uVar57 && uVar57 - uVar64 != 0)) {
            local_308._0_8_ = (PointerType)0x0;
            local_308._8_8_ = (pointer)0x0;
            local_308._16_8_ = (pointer)0x0;
            pvVar32 = (&((local_1f0.
                          super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)[(long)local_2a8];
            puVar10 = pvVar32[uVar64].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            for (puVar51 = pvVar32[uVar64].
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start; pGVar66 = local_290,
                puVar51 != puVar10; puVar51 = puVar51 + 1) {
              lVar65 = (long)(local_340->elements).element_blocks.
                             super__Vector_base<lf::io::GMshFileV4::ElementBlock,_std::allocator<lf::io::GMshFileV4::ElementBlock>_>
                             ._M_impl.super__Vector_impl_data._M_start[*puVar51].entity_tag;
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_308,
                         local_308._8_8_,
                         *(undefined8 *)(*(long *)(local_1b8 + lVar62) + lVar65 * 0x18),
                         *(undefined8 *)(*(long *)(local_1b8 + lVar62) + 8 + lVar65 * 0x18));
            }
            pvVar40 = lf::mesh::utils::
                      AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator()((local_290->physical_nrs_).
                                   super___shared_ptr<lf::mesh::utils::AllCodimMeshDataSet<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,e);
            puVar17 = (pvVar40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar18 = (pvVar40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage;
            (pvVar40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_308._0_8_;
            (pvVar40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_308._8_8_;
            (pvVar40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)local_308._16_8_;
            local_308._0_8_ = (PointerType)0x0;
            local_308._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_308._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pGVar52 = local_340;
            if ((puVar17 != (pointer)0x0) &&
               (operator_delete(puVar17,(long)puVar18 - (long)puVar17), pGVar52 = local_340,
               (PointerType)local_308._0_8_ != (PointerType)0x0)) {
              operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
              pGVar52 = local_340;
            }
          }
          puVar39 = puVar39 + 1;
        } while ((pointer)puVar39 != local_2a0);
      }
      uVar64 = local_288 + 1;
    } while (uVar64 != local_1f8);
    pPVar61 = (pGVar52->physical_names).
              super__Vector_base<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_2a8 = (pGVar52->physical_names).
                super__Vector_base<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar61 != local_2a8) {
      local_340 = (GMshFileV4 *)&pGVar66->name_2_nr_;
      do {
        iVar28 = pPVar61->dimension;
        iVar53 = pPVar61->physical_tag;
        local_308._0_8_ = local_308 + 0x10;
        pcVar19 = (pPVar61->name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_308,pcVar19,pcVar19 + (pPVar61->name)._M_string_length);
        local_2f0._8_8_ = CONCAT44((int)local_310 - iVar28,iVar53);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
        ::_M_emplace_equal<std::pair<std::__cxx11::string,std::pair<int,unsigned_int>>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,unsigned_int>>>>
                    *)local_340,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_unsigned_int>_>
                    *)local_308);
        paVar4 = &local_338.field_2;
        if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
          operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
        }
        uVar26 = (int)local_310 - pPVar61->dimension;
        pcVar19 = (pPVar61->name)._M_dataplus._M_p;
        local_338._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_338,pcVar19,pcVar19 + (pPVar61->name)._M_string_length);
        local_308._0_4_ = pPVar61->physical_tag;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p == paVar4) {
          local_2f0._8_8_ = local_338.field_2._8_8_;
          local_308._8_8_ = &local_2f0;
        }
        else {
          local_308._8_8_ = local_338._M_dataplus._M_p;
        }
        local_2f0._0_8_ = local_338.field_2._M_allocated_capacity;
        local_308._16_8_ = local_338._M_string_length;
        local_338._M_string_length = 0;
        local_338.field_2._M_allocated_capacity =
             local_338.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_338._M_dataplus._M_p = (pointer)paVar4;
        local_318 = uVar26;
        local_2e0 = uVar26;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>>
        ::_M_emplace_equal<std::pair<int,std::pair<std::__cxx11::string,unsigned_int>>>
                  ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>,std::_Select1st<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>>
                    *)&pGVar66->nr_2_name_,
                   (pair<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                    *)local_308);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._8_8_ != &local_2f0) {
          operator_delete((void *)local_308._8_8_,(ulong)(local_2f0._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != paVar4) {
          operator_delete(local_338._M_dataplus._M_p,
                          (ulong)(local_338.field_2._M_allocated_capacity + 1));
        }
        pPVar61 = pPVar61 + 1;
      } while (pPVar61 != local_2a8);
    }
    lVar62 = 0x48;
    do {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)(local_1b8 + lVar62));
      lVar62 = lVar62 + -0x18;
    } while (lVar62 != -0x18);
    if (local_1d8.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d8.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d8.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.
                            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~vector(&local_1f0);
    if (local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_260.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"MshFile contains no elements with dimension ",0x2c);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  pdVar5 = (PointerType)(local_308 + 0x10);
  local_308._0_8_ = pdVar5;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,"num_entities[dim_mesh] > 0","");
  paVar4 = &local_338.field_2;
  local_338._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed((string *)local_308,&local_338,0x19e,&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != paVar4) {
    operator_delete(local_338._M_dataplus._M_p,(ulong)(local_338.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((PointerType)local_308._0_8_ != pdVar5) {
    operator_delete((void *)local_308._0_8_,(ulong)(local_308._16_8_ + 1));
  }
  local_308._0_8_ = pdVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"false","");
  local_338._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_reader.cc"
             ,"");
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"");
  base::AssertionFailed((string *)local_308,&local_338,0x19e,&local_2c8);
LAB_0020c070:
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)local_308);
  abort();
}

Assistant:

void GmshReader::InitGmshFile(const GMshFileV4& msh_file) {
  // 1) Check Gmsh_file and initialize
  //////////////////////////////////////////////////////////////////////////

  const dim_t dim_mesh = mesh_factory_->DimMesh();
  const dim_t dim_world = mesh_factory_->DimWorld();
  LF_VERIFY_MSG(
      dim_mesh >= 2 && dim_mesh <= 3 && dim_world >= 2 && dim_world <= 3,
      "GmshReader supports only 2D and 3D meshes.");

  // 1) Determine which nodes of gmsh are also nodes of the LehrFEM++ mesh +
  // count number of entities of each codimension (exclude auxilliary nodes).
  // This is necessary because e.g. second order meshes in gmsh need a lot of
  // auxilliary nodes to define their geometry...
  /////////////////////////////////////////////////////////////////////////////
  auto min_node_tag = msh_file.nodes.min_node_tag;
  auto max_node_tag = msh_file.nodes.max_node_tag;

  // is_main_node[i] = true means that gmsh-node (i + min_node_tag) is one of
  // the main nodes of an element
  std::vector<bool> is_main_node(max_node_tag - min_node_tag + 1, false);

  // mi2gi = mesh_index_2_gmsh_index
  // mi2gi[c][i] contains the index of the gmsh entity block that contains
  // the mesh entity with codim = c and mesh index i.
  std::vector<std::vector<std::vector<std::size_t>>> mi2gi(dim_mesh + 1);

  {
    // count the number of entities for each codimension and reserve space:
    std::vector<size_type> num_entities(mesh_factory_->DimMesh() + 1, 0);

    for (const auto& eb : msh_file.elements.element_blocks) {
      LF_ASSERT_MSG(eb.dimension <= dim_mesh,
                    "mesh_factory->DimMesh() = "
                        << dim_mesh
                        << ", but msh-file contains entities with dimension "
                        << DimOf(eb.element_type));
      LF_ASSERT_MSG(eb.dimension == DimOf(eb.element_type),
                    "error in GmshFile: Mismatch between entity block type ("
                        << eb.element_type << ") and dimension ("
                        << DimOf(eb.element_type) << ")");

      num_entities[eb.dimension] += eb.elements.size();

      if (eb.dimension == dim_mesh) {
        // mark main nodes
        auto ref_el = RefElOf(eb.element_type);
        for (const auto& element : eb.elements) {
          const auto& node_indices = std::get<1>(element);
          for (unsigned int i = 0; i < ref_el.NumNodes(); ++i) {
            auto node_tag = node_indices[i];
            if (is_main_node.size() <= node_tag - min_node_tag) {
              is_main_node.resize(node_tag - min_node_tag + 1);
            }
            is_main_node[node_tag - min_node_tag] = true;
          }
        }
      }
    }

    for (dim_t c = 0; c <= dim_mesh; ++c) {
      mi2gi[c].reserve(num_entities[dim_mesh - c]);
    }

    LF_ASSERT_MSG(num_entities[dim_mesh] > 0,
                  "MshFile contains no elements with dimension " << dim_mesh);
  }

  // 2) Insert main nodes into MeshFactory
  /////////////////////////////////////////////////////////////////////////////

  // gmsh_index_2_mesh_index for nodes:
  // gi2mi[i] = j means that gmsh node with gmsh tag i+min_node_tag has mesh
  // index j
  std::vector<size_type> gi2mi;
  gi2mi.resize(is_main_node.size(), -1);

  // gi2i[i] = (j,k) implies msh_file.nodes.node_blocks[j].nodes[k].first = i +
  // min_node_tag
  std::vector<std::pair<size_type, size_type>> gi2i;
  gi2i.resize(is_main_node.size(), {-1, -1});

  for (std::size_t j = 0; j < msh_file.nodes.node_blocks.size(); ++j) {
    const auto& node_block = msh_file.nodes.node_blocks[j];
    for (std::size_t k = 0; k < node_block.nodes.size(); ++k) {
      const auto& n = node_block.nodes[k];
      LF_ASSERT_MSG(gi2i.size() > n.first - min_node_tag,
                    "error: node_tag is higher than max_node_tag");

      gi2i[n.first - min_node_tag] = std::make_pair(j, k);

      if (!is_main_node[n.first - min_node_tag]) {
        continue;
      }

      size_type mi;
      if (dim_world == 2) {
        LF_ASSERT_MSG(
            n.second(2) == 0,
            "In a 2D GmshMesh, the z-coordinate of every node must be zero");
        mi = mesh_factory_->AddPoint(n.second.topRows(2));
      } else {
        mi = mesh_factory_->AddPoint(n.second);
      }
      gi2mi[n.first - min_node_tag] = mi;
    }
  }

  // 3) Insert entities (except nodes) into MeshFactory:
  //////////////////////////////////////////////////////////////////////////////

  for (std::size_t ebi = 0; ebi < msh_file.elements.element_blocks.size();
       ++ebi) {
    const auto& element_block = msh_file.elements.element_blocks[ebi];
    std::size_t begin = 0;
    auto ref_el = RefElOf(element_block.element_type);
    auto codim = dim_mesh - ref_el.Dimension();

    for (std::size_t end = 0; end < element_block.elements.size(); ++end) {
      const auto& begin_element = element_block.elements[begin];
      const auto& end_element = element_block.elements[end];

      if (begin_element.second == end_element.second && begin != end) {
        // This entity appears more than once
        mi2gi[codim].back().emplace_back(ebi);
        continue;
      }

      begin = end;
      if (ref_el == base::RefEl::kPoint()) {
        // check that this node is a main node (auxiliary nodes are not
        // inserted into the mesh!):

        auto mesh_index = gi2mi[end_element.second[0] - min_node_tag];
        if (mesh_index != std::numeric_limits<unsigned int>::max()) {
          // special case, this entity is a point (which has already been
          // inserted)
          if (mi2gi[dim_mesh].size() <= mesh_index) {
            mi2gi[dim_mesh].resize(mesh_index + 1);
          }
          mi2gi[dim_mesh][mesh_index].emplace_back(ebi);
        }
      } else {
        // gmsh element is not a point -> insert entity:
        auto num_nodes = base::narrow<Eigen::Index>(end_element.second.size());
        Eigen::MatrixXd node_coords(dim_world, num_nodes);
        for (Eigen::Index i = 0; i < num_nodes; ++i) {
          auto& gi2i_e = gi2i[end_element.second[i] - min_node_tag];
          auto node_coord = msh_file.nodes.node_blocks[gi2i_e.first]
                                .nodes[gi2i_e.second]
                                .second;
          if (dim_world == 2) {
            node_coords.col(i) = node_coord.topRows(2);
          } else {
            node_coords.col(i) = node_coord;
          }
        }
        std::unique_ptr<geometry::Geometry> geom;

        switch (element_block.element_type) {
          case GMshFileV4::ElementType::EDGE2:
            ref_el = base::RefEl::kSegment();
            geom = std::make_unique<geometry::SegmentO1>(node_coords);
            break;
          case GMshFileV4::ElementType::EDGE3:
            ref_el = base::RefEl::kSegment();
            geom = std::make_unique<geometry::SegmentO2>(node_coords);
            break;
          case GMshFileV4::ElementType::TRIA3:
            ref_el = base::RefEl::kTria();
            geom = std::make_unique<geometry::TriaO1>(node_coords);
            break;
          case GMshFileV4::ElementType::TRIA6:
            ref_el = base::RefEl::kTria();
            geom = std::make_unique<geometry::TriaO2>(node_coords);
            break;
          case GMshFileV4::ElementType::QUAD4:
            ref_el = base::RefEl::kQuad();
            geom = std::make_unique<geometry::QuadO1>(node_coords);
            break;
          case GMshFileV4::ElementType::QUAD8:
            ref_el = base::RefEl::kQuad();
            geom = std::make_unique<geometry::QuadO2>(node_coords);
            break;
          case GMshFileV4::ElementType::QUAD9:
            ref_el = base::RefEl::kQuad();
            geom = std::make_unique<geometry::QuadO2>(node_coords.leftCols(8));
            break;
          default:
            LF_VERIFY_MSG(false, "Gmsh element type "
                                     << element_block.element_type
                                     << " not (yet) supported by GmshReader.");
        }
        std::vector<size_type> main_nodes(ref_el.NumNodes());
        for (dim_t i = 0; i < ref_el.NumNodes(); ++i) {
          main_nodes[i] = gi2mi[end_element.second[i] - min_node_tag];
        }

        mesh_factory_->AddEntity(ref_el, main_nodes, std::move(geom));
        mi2gi[codim].push_back(std::vector<std::size_t>{ebi});
      }
    }
  }

  // 4) Construct mesh
  /////////////////////////////////////////////////////////////////////////////
  mesh_ = mesh_factory_->Build();

  // 5) Create a mapping gmsh entity -> physical entity
  /////////////////////////////////////////////////////////////////////////////

  // GMsh Entity index to GMsh physical entity index.
  // gmei2gphi[c][i] contains all physical entity tags that belong to entity
  // with tag i and codim c
  std::array<std::vector<std::vector<int>>, 4> gmei2gmphi;

  auto makeMap = [](std::vector<std::vector<int>>& result, auto& entities) {
    // find largest entity tag:
    int max_entity_tag = 0;
    for (auto& e : entities) {
      max_entity_tag = std::max(max_entity_tag, e.tag);
    }
    result.resize(max_entity_tag + 1);

    // build map:
    for (auto& e : entities) {
      result[e.tag] = e.physical_tags;
    }
  };

  if (msh_file.partitioned_entities.num_partitions == 0) {
    makeMap(gmei2gmphi[dim_mesh], std::get<0>(msh_file.entities));
    makeMap(gmei2gmphi[dim_mesh - 1], std::get<1>(msh_file.entities));
    makeMap(gmei2gmphi[dim_mesh - 2], std::get<2>(msh_file.entities));
    if (dim_mesh == 3) {
      makeMap(gmei2gmphi[0], std::get<3>(msh_file.entities));
    }
  } else {
    makeMap(gmei2gmphi[dim_mesh],
            std::get<0>(msh_file.partitioned_entities.partitioned_entities));
    makeMap(gmei2gmphi[dim_mesh - 1],
            std::get<1>(msh_file.partitioned_entities.partitioned_entities));
    makeMap(gmei2gmphi[dim_mesh - 2],
            std::get<2>(msh_file.partitioned_entities.partitioned_entities));
    if (dim_mesh == 3) {
      makeMap(gmei2gmphi[0],
              std::get<3>(msh_file.partitioned_entities.partitioned_entities));
    }
  }

  // 6) Build MeshDataSet that assigns the physical entitiies:
  /////////////////////////////////////////////////////////////////////////////
  physical_nrs_ =
      mesh::utils::make_AllCodimMeshDataSet<std::vector<size_type>>(mesh_);

  for (dim_t c = 0; c <= dim_mesh; ++c) {
    for (const auto* e : mesh_->Entities(c)) {
      auto mi = mesh_->Index(*e);
      if (c == dim_mesh && mi >= mi2gi[dim_mesh].size()) {
        // this point did not appear as a gmsh element in the file -> don't
        // assign any physical entity nr.
        continue;
      }
      if (mi2gi[c].size() > mi) {
        std::vector<size_type> temp;
        for (auto& gmsh_index : mi2gi[c][mi]) {
          const auto& element_block =
              msh_file.elements.element_blocks[gmsh_index];
          auto& physical_tags = gmei2gmphi[c][element_block.entity_tag];
          temp.insert(std::end(temp), std::begin(physical_tags),
                      std::end(physical_tags));
        }

        physical_nrs_->operator()(*e) = std::move(temp);
      }
    }
  }

  // 7) Create mapping physicalEntityNr <-> physicalEntityName:
  //////////////////////////////////////////////////////////////////////////

  for (const auto& pn : msh_file.physical_names) {
    name_2_nr_.insert(std::pair{
        pn.name, std::pair{pn.physical_tag, dim_mesh - pn.dimension}});
    nr_2_name_.insert(std::pair{pn.physical_tag,
                                std::pair{pn.name, dim_mesh - pn.dimension}});
  }

  if (!msh_file.periodic_links.empty()) {
    /*LOGGER_ENTRY(logger_,
                 "WARNING: GMSH File  contains periodic boundary relations "
                 "between elements. These are ignored by GmshReader.",
                 3);*/
  }
}